

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall defyx::Instruction::h_IMUL_RCP(Instruction *this,ostream *os)

{
  byte bVar1;
  ostream *poVar2;
  
  bVar1 = this->dst;
  poVar2 = std::operator<<(os,"r");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1 & 7);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Instruction::h_IMUL_RCP(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		os << "r" << dstIndex << ", " << getImm32() << std::endl;
	}